

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

SN_ELEMENT * __thiscall
ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::SetCapacity
          (ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *this,size_t new_capacity)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  if (*(int *)(this + 0x14) == 0) {
    *(undefined8 *)(this + 8) = 0;
    *(undefined4 *)(this + 0x10) = 0;
  }
  iVar3 = (int)new_capacity;
  if (0x7ffffffe < new_capacity - 1 >> 1) {
    iVar3 = 0;
  }
  if (iVar3 != *(int *)(this + 0x14)) {
    if (iVar3 < 1) {
      if (*(long *)(this + 8) != 0) {
        (**(code **)(*(long *)this + 0x18))(this,*(long *)(this + 8),0);
        *(undefined8 *)(this + 8) = 0;
        *(undefined8 *)(this + 0x10) = 0;
      }
    }
    else {
      if (iVar3 < *(int *)(this + 0x10)) {
        *(int *)(this + 0x10) = iVar3;
      }
      lVar2 = (**(code **)(*(long *)this + 0x18))(this,*(undefined8 *)(this + 8),iVar3);
      *(long *)(this + 8) = lVar2;
      if (lVar2 == 0) {
        *(undefined8 *)(this + 0x10) = 0;
      }
      else {
        iVar1 = *(int *)(this + 0x14);
        if (iVar1 < iVar3) {
          memset((void *)(lVar2 + (long)iVar1 * 0x38),0,(long)(iVar3 - iVar1) * 0x38);
        }
        *(int *)(this + 0x14) = iVar3;
      }
    }
  }
  return *(SN_ELEMENT **)(this + 8);
}

Assistant:

T* ON_SimpleArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }

  // sets capacity to input value
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX) 
               ? (int)new_capacity 
               : 0;
  if ( capacity != m_capacity ) {
    if( capacity > 0 ) {
      if ( m_count > capacity )
        m_count = capacity;
      // NOTE: Realloc() does an allocation if the first argument is nullptr.
      m_a = Realloc( m_a, capacity );
      if ( m_a ) {
        if ( capacity > m_capacity ) {
          // zero new memory
          memset( (void*) (m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
        }
        m_capacity = capacity;
      }
      else {
        // out of memory
        m_count = m_capacity = 0;
      }
    }
    else if (m_a) {
      Realloc(m_a,0);
      m_a = 0;
      m_count = m_capacity = 0;
    }
  }
  return m_a;
}